

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O3

void __thiscall
TTD::BinaryFormatWriter::WriteNakedString
          (BinaryFormatWriter *this,TTString *val,Separator separator)

{
  bool bVar1;
  undefined7 in_register_00000011;
  uint local_1c;
  
  (*(this->super_FileWriter)._vptr_FileWriter[2])
            (this,CONCAT71(in_register_00000011,separator) & 0xffffffff);
  bVar1 = IsNullPtrTTString(val);
  if (bVar1) {
    local_1c = 0xffffffff;
    FileWriter::WriteRawByteBuff_Fixed<unsigned_int>(&this->super_FileWriter,&local_1c);
    return;
  }
  FileWriter::WriteRawByteBuff_Fixed<unsigned_int>(&this->super_FileWriter,&val->Length);
  FileWriter::WriteRawByteBuff(&this->super_FileWriter,(byte *)val->Contents,(ulong)val->Length * 2)
  ;
  return;
}

Assistant:

void BinaryFormatWriter::WriteNakedString(const TTString& val, NSTokens::Separator separator)
    {
        this->WriteSeparator(separator);

        if(IsNullPtrTTString(val))
        {
            this->WriteRawByteBuff_Fixed<uint32>(UINT32_MAX);
        }
        else
        {
            this->WriteRawByteBuff_Fixed<uint32>(val.Length);
            this->WriteRawByteBuff((const byte*)val.Contents, val.Length * sizeof(char16));
        }
    }